

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlText::TiXmlText(TiXmlText *this,char *initValue)

{
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,TEXT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_0019c708;
  TiXmlString::operator=(&(this->super_TiXmlNode).value,initValue);
  this->cdata = false;
  return;
}

Assistant:

TiXmlText(const char * initValue) :
		TiXmlNode(TiXmlNode::TEXT) {
		SetValue(initValue);
		cdata = false;
	}